

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall mp::StringFileWriter::Write<char_const*>(StringFileWriter *this,char *s)

{
  int iVar1;
  StringFileWriter *in_RDI;
  int l;
  char *in_stack_ffffffffffffffd8;
  
  if ((in_RDI->fTriedOpen_ & 1U) == 0) {
    Open(in_RDI);
  }
  in_RDI->cnt_ = in_RDI->cnt_ + 1;
  iVar1 = Print_ReturnLen1(in_RDI,in_stack_ffffffffffffffd8);
  if (*in_RDI->len_max_ < iVar1) {
    *in_RDI->len_max_ = iVar1;
  }
  return;
}

Assistant:

void Write(Value s) {
    if (!fTriedOpen_)
      Open();
    ++cnt_;
    auto l = Print_ReturnLen1(s);
    if (l>len_max_)
      len_max_ = l;
  }